

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Scene>
          (Structure *this,Scene *dest,FileDatabase *db)

{
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->camera,"*camera",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::World>(this,&dest->world,"*world",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Base>(this,&dest->basact,"*basact",db,false);
  ReadField<1,Assimp::Blender::ListBase>(this,&dest->base,"base",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Scene> (
    Scene& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.camera,"*camera",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.world,"*world",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.basact,"*basact",db);
    ReadField<ErrorPolicy_Igno>(dest.base,"base",db);

    db.reader->IncPtr(size);
}